

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_casts.cpp
# Opt level: O1

string_t __thiscall duckdb::IntToVarInt<int>(duckdb *this,Vector *result,int int_value)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  undefined4 in_register_00000014;
  idx_t len;
  idx_t extraout_RDX;
  ulong uVar4;
  char *blob_00;
  uint uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  string_t blob;
  undefined1 local_48 [16];
  ulong local_38;
  
  len = CONCAT44(in_register_00000014,int_value);
  uVar4 = (ulong)result & 0xffffffff;
  uVar2 = uVar4;
  if ((int)result < 0) {
    uVar2 = -(long)(int)result;
  }
  if (uVar2 == 0) {
    uVar5 = 1;
  }
  else {
    lVar3 = uVar2 + 1;
    auVar7._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar7._0_8_ = lVar3;
    auVar7._12_4_ = 0x45300000;
    dVar6 = log2((auVar7._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
    dVar6 = ceil(dVar6 * 0.125);
    uVar5 = (uint)(long)dVar6;
    len = extraout_RDX;
  }
  local_48 = (undefined1  [16])
             StringVector::EmptyString((StringVector *)this,(Vector *)(ulong)(uVar5 + 3),len);
  blob_00 = local_48._8_8_;
  if (local_48._0_4_ < 0xd) {
    blob_00 = local_48 + 4;
  }
  local_38 = (ulong)uVar5;
  Varint::SetHeader(blob_00,local_38,SUB81(uVar4 >> 0x1f,0));
  if (0 < (int)uVar5) {
    lVar3 = local_38 * 8;
    lVar1 = 3;
    do {
      lVar3 = lVar3 + -8;
      blob_00[lVar1] = (byte)(uVar2 >> ((byte)lVar3 & 0x3f)) ^ (char)(uVar4 >> 0x18) >> 7;
      lVar1 = lVar1 + 1;
    } while ((Vector *)(ulong)(uVar5 + 3) != (Vector *)lVar1);
  }
  uVar2 = (ulong)(uint)local_48._0_4_;
  if (uVar2 < 0xd) {
    switchD_0105b559::default(local_48 + 4 + uVar2,0,0xc - uVar2);
  }
  else {
    local_48._4_4_ = *(undefined4 *)local_48._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_48;
}

Assistant:

string_t IntToVarInt(Vector &result, T int_value) {
	// Determine if the number is negative
	bool is_negative = int_value < 0;
	// Determine the number of data bytes
	uint64_t abs_value;
	if (is_negative) {
		if (int_value == std::numeric_limits<T>::min()) {
			abs_value = static_cast<uint64_t>(std::numeric_limits<T>::max()) + 1;
		} else {
			abs_value = static_cast<uint64_t>(std::abs(static_cast<int64_t>(int_value)));
		}
	} else {
		abs_value = static_cast<uint64_t>(int_value);
	}
	uint32_t data_byte_size;
	if (abs_value != NumericLimits<uint64_t>::Maximum()) {
		data_byte_size = (abs_value == 0) ? 1 : static_cast<uint32_t>(std::ceil(std::log2(abs_value + 1) / 8.0));
	} else {
		data_byte_size = static_cast<uint32_t>(std::ceil(std::log2(abs_value) / 8.0));
	}

	uint32_t blob_size = data_byte_size + Varint::VARINT_HEADER_SIZE;
	auto blob = StringVector::EmptyString(result, blob_size);
	auto writable_blob = blob.GetDataWriteable();
	Varint::SetHeader(writable_blob, data_byte_size, is_negative);

	// Add data bytes to the blob, starting off after header bytes
	idx_t wb_idx = Varint::VARINT_HEADER_SIZE;
	for (int i = static_cast<int>(data_byte_size) - 1; i >= 0; --i) {
		if (is_negative) {
			writable_blob[wb_idx++] = static_cast<char>(~(abs_value >> i * 8 & 0xFF));
		} else {
			writable_blob[wb_idx++] = static_cast<char>(abs_value >> i * 8 & 0xFF);
		}
	}
	blob.Finalize();
	return blob;
}